

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVJobServerClient.cxx
# Opt level: O0

bool __thiscall anon_unknown.dwarf_d9120::JobRunner::Run(JobRunner *this)

{
  int iVar1;
  uv_loop_t *loop;
  ostream *poVar2;
  cmUVJobServerClient *pcVar3;
  JobRunner *this_local;
  
  if ((this->Okay & 1U) != 0) {
    QueueNextJobs(this);
    loop = ::cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&this->Loop);
    uv_run(loop,UV_RUN_DEFAULT);
    poVar2 = std::operator<<((ostream *)&std::cerr,"HeldTokens: ");
    pcVar3 = std::optional<cmUVJobServerClient>::operator->(&this->JSC);
    iVar1 = cmUVJobServerClient::GetHeldTokens(pcVar3);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cerr,"NeedTokens: ");
    pcVar3 = std::optional<cmUVJobServerClient>::operator->(&this->JSC);
    iVar1 = cmUVJobServerClient::GetNeedTokens(pcVar3);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::operator<<(poVar2,'\n');
  }
  return (bool)(this->Okay & 1);
}

Assistant:

bool Run()
  {
    if (this->Okay) {
      this->QueueNextJobs();
      uv_run(this->Loop, UV_RUN_DEFAULT);
      std::cerr << "HeldTokens: " << this->JSC->GetHeldTokens() << '\n';
      std::cerr << "NeedTokens: " << this->JSC->GetNeedTokens() << '\n';
    }
#ifdef _WIN32
    // FIXME: Windows job server client not yet implemented.
    return true;
#else
    return this->Okay;
#endif
  }